

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<void_(double,_double,_mp::var::Type)>::PerformDefaultAction
          (FunctionMockerBase<void_(double,_double,_mp::var::Type)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<void_(double,_double,_mp::var::Type)> *this_00;
  Action<void_(double,_double,_mp::var::Type)> *this_01;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<void_(double,_double,_mp::var::Type)> *)0x0) {
    this_01 = OnCallSpec<void_(double,_double,_mp::var::Type)>::GetAction(this_00);
    Action<void_(double,_double,_mp::var::Type)>::Perform(this_01,args);
    return;
  }
  std::operator+(&local_30,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }